

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

float __thiscall
ktx::OptionsEncodeBasis<false>::captureCodecOption<float>
          (OptionsEncodeBasis<false> *this,ParseResult *args,char *name)

{
  float fVar1;
  string_view fmt;
  float *pfVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  ParseResult *in_RDI;
  format_args in_stack_000000b8;
  float value;
  string *in_stack_fffffffffffffe78;
  OptionValue *in_stack_fffffffffffffea0;
  char *args_1;
  string local_150 [55];
  allocator<char> local_119;
  string local_118 [36];
  float local_f4;
  v10 local_f0 [24];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_float>
  local_d8;
  undefined8 local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_float>
  *local_b0;
  float *local_a8;
  char **local_98;
  v10 *local_90;
  undefined1 local_88 [16];
  string *local_78;
  char *local_70;
  undefined1 *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  float *local_48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_float>
  *local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_float>
  *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*,_float>
  *local_10;
  char *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDX,in_RSI,(allocator<char> *)in_RDI);
  cxxopts::ParseResult::operator[](in_RDI,in_stack_fffffffffffffe78);
  pfVar2 = cxxopts::OptionValue::as<float>(in_stack_fffffffffffffea0);
  fVar1 = *pfVar2;
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  local_68 = &stack0xfffffffffffffea0;
  local_70 = " --{} {}";
  local_60 = " --{} {}";
  args_1 = " --{} {}";
  local_f4 = fVar1;
  local_58 = local_68;
  std::char_traits<char>::length((char_type *)0x223994);
  local_8 = local_70;
  local_90 = local_f0;
  local_98 = (char **)&local_f4;
  local_50 = local_88;
  local_a8 = (float *)args_1;
  local_78 = local_150;
  local_48 = (float *)args_1;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*,float_const>
            (&local_d8,local_90,local_98,(float *)args_1);
  local_30 = &local_b8;
  local_20 = 0x9c;
  local_b8 = 0x9c;
  fmt.size_ = (size_t)args;
  fmt.data_ = name;
  local_38 = &local_d8;
  local_28 = &local_d8;
  local_18 = local_30;
  local_10 = &local_d8;
  local_b0 = &local_d8;
  ::fmt::v10::vformat_abi_cxx11_(fmt,in_stack_000000b8);
  std::__cxx11::string::operator+=((string *)&in_RDI[1].m_keys._M_h._M_bucket_count,local_150);
  std::__cxx11::string::~string(local_150);
  return local_f4;
}

Assistant:

T captureCodecOption(cxxopts::ParseResult& args, const char* name) {
        const T value = args[name].as<T>();
        codecOptions += fmt::format(" --{} {}", name, value);
        return value;
    }